

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

Time __thiscall absl::DeadlineFromTimeout(absl *this,Duration timeout)

{
  timeval tv_00;
  Time TVar1;
  Time TVar2;
  Time lhs;
  Duration rhs;
  undefined1 auStack_38 [8];
  timeval tv;
  Duration timeout_local;
  
  tv.tv_usec = (__suseconds_t)this;
  gettimeofday((timeval *)auStack_38,(__timezone_ptr_t)0x0);
  tv_00.tv_usec = tv.tv_sec;
  tv_00.tv_sec = (__time_t)auStack_38;
  TVar1 = TimeFromTimeval(tv_00);
  rhs.rep_lo_ = (int)timeout.rep_hi_;
  rhs.rep_hi_ = tv.tv_usec;
  lhs.rep_._12_4_ = 0;
  lhs.rep_.rep_hi_ = SUB128(TVar1.rep_._0_12_,0);
  lhs.rep_.rep_lo_ = SUB124(TVar1.rep_._0_12_,8);
  rhs._12_4_ = 0;
  TVar1 = operator+(lhs,rhs);
  TVar2.rep_._12_4_ = 0;
  TVar2.rep_.rep_hi_ = SUB128(TVar1.rep_._0_12_,0);
  TVar2.rep_.rep_lo_ = SUB124(TVar1.rep_._0_12_,8);
  return (Time)TVar2.rep_;
}

Assistant:

static absl::Time DeadlineFromTimeout(absl::Duration timeout) {
#ifndef _WIN32
  struct timeval tv;
  gettimeofday(&tv, nullptr);
  return absl::TimeFromTimeval(tv) + timeout;
#else
  return absl::Now() + timeout;
#endif
}